

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O2

void __thiscall Population::Population(Population *this,int amount,string *modelName)

{
  vector<Neuron_*,_std::allocator<Neuron_*>_> *this_00;
  bool bVar1;
  iaf_psc_alpha *piVar2;
  int iVar3;
  iaf_psc_alpha *local_40;
  Population *local_38;
  
  this->_vptr_Population = (_func_int **)&PTR_update_001358c8;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->neurons;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->neurons).super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->numberOfNeurons = amount;
  this->numberOfOutputNeurons = amount;
  this->numberOfInputNeurons = amount;
  local_38 = this;
  initialize(this);
  bVar1 = std::operator==(modelName,"iaf");
  if (bVar1) {
    iVar3 = 0;
    if (0 < amount) {
      iVar3 = amount;
    }
    while (bVar1 = iVar3 != 0, iVar3 = iVar3 + -1, bVar1) {
      piVar2 = (iaf_psc_alpha *)operator_new(0x50);
      LIF::LIF((LIF *)piVar2);
      local_40 = piVar2;
      std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
    }
  }
  else {
    bVar1 = std::operator==(modelName,"izhikevich");
    if (bVar1) {
      iVar3 = 0;
      if (amount < 1) {
        amount = 0;
      }
      for (; amount != iVar3; iVar3 = iVar3 + 1) {
        piVar2 = (iaf_psc_alpha *)operator_new(0x60);
        Izhikevich::Izhikevich((Izhikevich *)piVar2,(long)local_38,iVar3);
        local_40 = piVar2;
        std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                  ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
      }
    }
    else {
      bVar1 = std::operator==(modelName,"CurrentGenerator");
      if (bVar1) {
        iVar3 = 0;
        if (0 < amount) {
          iVar3 = amount;
        }
        while (bVar1 = iVar3 != 0, iVar3 = iVar3 + -1, bVar1) {
          piVar2 = (iaf_psc_alpha *)operator_new(0x60);
          CurrentGenerator::CurrentGenerator((CurrentGenerator *)piVar2);
          local_40 = piVar2;
          std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                    ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
        }
      }
      else {
        bVar1 = std::operator==(modelName,"SignalGenerator");
        if (bVar1) {
          iVar3 = 0;
          if (0 < amount) {
            iVar3 = amount;
          }
          while (bVar1 = iVar3 != 0, iVar3 = iVar3 + -1, bVar1) {
            piVar2 = (iaf_psc_alpha *)operator_new(0x60);
            SignalGenerator::SignalGenerator((SignalGenerator *)piVar2);
            local_40 = piVar2;
            std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                      ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
          }
        }
        else {
          bVar1 = std::operator==(modelName,"PassThrough");
          if (bVar1) {
            iVar3 = 0;
            if (0 < amount) {
              iVar3 = amount;
            }
            while (bVar1 = iVar3 != 0, iVar3 = iVar3 + -1, bVar1) {
              piVar2 = (iaf_psc_alpha *)operator_new(0x48);
              PassThrough::PassThrough((PassThrough *)piVar2);
              local_40 = piVar2;
              std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                        ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
            }
          }
          else {
            bVar1 = std::operator==(modelName,"iaf_psc_alpha");
            if (bVar1) {
              iVar3 = 0;
              if (amount < 1) {
                amount = 0;
              }
              for (; amount != iVar3; iVar3 = iVar3 + 1) {
                piVar2 = (iaf_psc_alpha *)operator_new(0x118);
                iaf_psc_alpha::iaf_psc_alpha(piVar2,(long)local_38,iVar3);
                local_40 = piVar2;
                std::vector<Neuron*,std::allocator<Neuron*>>::emplace_back<Neuron*>
                          ((vector<Neuron*,std::allocator<Neuron*>> *)this_00,(Neuron **)&local_40);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Population(int amount, std::string modelName) {
        numberOfNeurons = amount;
        numberOfOutputNeurons = numberOfOutputNeurons == 0? amount : numberOfOutputNeurons;
        numberOfInputNeurons = numberOfInputNeurons == 0? amount : numberOfInputNeurons;
        initialize();
        if(modelName == "iaf") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new LIF());
            }
        }
        else if(modelName == "izhikevich") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new Izhikevich((long)this, i));
            }
        }
        else if(modelName == "CurrentGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new CurrentGenerator());
            }
        }
        else if(modelName == "SignalGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new SignalGenerator());
            }
        }
        else if(modelName == "PassThrough") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new PassThrough());
            }
        }
        else if(modelName == "iaf_psc_alpha") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new iaf_psc_alpha((long)this, i));
            }
        }
    }